

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_c.c
# Opt level: O0

uint32_t adler32_c(uint32_t adler,uint8_t *buf,size_t len)

{
  uint sum2_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint8_t *in_RDX;
  byte *in_RSI;
  uint in_EDI;
  uint n;
  uint32_t sum2;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar8;
  uint local_8;
  uint32_t local_4;
  
  sum2_00 = in_EDI >> 0x10;
  local_8 = in_EDI & 0xffff;
  if (in_RDX == (uint8_t *)0x1) {
    local_4 = adler32_len_1(local_8,in_RSI,sum2_00);
  }
  else if (in_RSI == (byte *)0x0) {
    local_4 = 1;
  }
  else if (in_RDX < (uint8_t *)0x10) {
    local_4 = adler32_len_16(local_8,in_RSI,(size_t)in_RDX,sum2_00);
  }
  else {
    while ((uint8_t *)0x15af < in_RDX) {
      in_RDX = in_RDX + -0x15b0;
      iVar8 = 0x2b6;
      do {
        iVar1 = *in_RSI + local_8;
        iVar2 = (uint)in_RSI[1] + iVar1;
        iVar3 = (uint)in_RSI[2] + iVar2;
        iVar4 = (uint)in_RSI[3] + iVar3;
        iVar5 = (uint)in_RSI[4] + iVar4;
        iVar6 = (uint)in_RSI[5] + iVar5;
        iVar7 = (uint)in_RSI[6] + iVar6;
        local_8 = (uint)in_RSI[7] + iVar7;
        sum2_00 = local_8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1 + sum2_00;
        in_RSI = in_RSI + 8;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      local_8 = local_8 % 0xfff1;
      sum2_00 = sum2_00 % 0xfff1;
      in_stack_ffffffffffffffe0 = 0;
    }
    local_4 = adler32_len_64((uint32_t)((ulong)in_RSI >> 0x20),in_RDX,
                             CONCAT44(sum2_00,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  return local_4;
}

Assistant:

Z_INTERNAL uint32_t adler32_c(uint32_t adler, const uint8_t *buf, size_t len) {
    uint32_t sum2;
    unsigned n;

    /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (UNLIKELY(len == 1))
        return adler32_len_1(adler, buf, sum2);

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (UNLIKELY(buf == NULL))
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (UNLIKELY(len < 16))
        return adler32_len_16(adler, buf, len, sum2);

    /* do length NMAX blocks -- requires just one modulo operation */
    while (len >= NMAX) {
        len -= NMAX;
#ifdef UNROLL_MORE
        n = NMAX / 16;          /* NMAX is divisible by 16 */
#else
        n = NMAX / 8;           /* NMAX is divisible by 8 */
#endif
        do {
#ifdef UNROLL_MORE
            ADLER_DO16(adler, sum2, buf);          /* 16 sums unrolled */
            buf += 16;
#else
            ADLER_DO8(adler, sum2, buf, 0);         /* 8 sums unrolled */
            buf += 8;
#endif
        } while (--n);
        adler %= BASE;
        sum2 %= BASE;
    }

    /* do remaining bytes (less than NMAX, still just one modulo) */
    return adler32_len_64(adler, buf, len, sum2);
}